

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O1

void __thiscall duckdb::Linenoise::EditDeletePrevWord(Linenoise *this)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = this->pos;
  if (sVar1 != 0) {
    sVar2 = sVar1;
    do {
      sVar2 = sVar2 - 1;
      if ((0x20 < (ulong)(byte)this->buf[sVar2]) ||
         ((0x100002600U >> ((ulong)(byte)this->buf[sVar2] & 0x3f) & 1) == 0)) break;
      this->pos = sVar2;
    } while (sVar2 != 0);
  }
  sVar2 = this->pos;
  if (sVar2 != 0) {
    do {
      if (((ulong)(byte)this->buf[sVar2 - 1] < 0x21) &&
         ((0x100002600U >> ((ulong)(byte)this->buf[sVar2 - 1] & 0x3f) & 1) != 0)) goto LAB_0022182f;
      sVar2 = sVar2 - 1;
      this->pos = sVar2;
    } while (sVar2 != 0);
    sVar2 = 0;
  }
LAB_0022182f:
  memmove(this->buf + sVar2,this->buf + sVar1,(this->len - sVar1) + 1);
  this->len = this->len + (sVar2 - sVar1);
  RefreshLine(this);
  return;
}

Assistant:

void Linenoise::EditDeletePrevWord() {
	size_t old_pos = pos;
	size_t diff;

	while (pos > 0 && IsSpace(buf[pos - 1])) {
		pos--;
	}
	while (pos > 0 && !IsSpace(buf[pos - 1])) {
		pos--;
	}
	diff = old_pos - pos;
	memmove(buf + pos, buf + old_pos, len - old_pos + 1);
	len -= diff;
	RefreshLine();
}